

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stablesum.h
# Opt level: O0

double __thiscall soplex::StableSum::operator_cast_to_double(StableSum *this)

{
  StableSum<double> *this_local;
  
  return *(double *)this + *(double *)(this + 8);
}

Assistant:

operator double() const
   {
#ifdef SOPLEX_CHECK_STABLESUM

      if(spxAbs(checksum - (sum + c)) >= 1e-6)
         printf("stablesum viol: %g, rel: %g, checksum: %g\n", spxAbs(checksum - (sum + c)),
                spxAbs(checksum - (sum + c)) / SOPLEX_MAX(1.0, SOPLEX_MAX(spxAbs(checksum), spxAbs(sum + c))),
                checksum);

      assert(spxAbs(checksum - (sum + c)) < 1e-6);
#endif
      return sum + c;
   }